

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HebrewCalendar.cpp
# Opt level: O0

void __thiscall HebrewCalendar::HebrewCalendar(HebrewCalendar *this,int d)

{
  int iVar1;
  int iVar2;
  int iVar3;
  HebrewCalendar local_78;
  HebrewCalendar local_60;
  HebrewCalendar local_48;
  HebrewCalendar local_30;
  int local_14;
  HebrewCalendar *pHStack_10;
  int d_local;
  HebrewCalendar *this_local;
  
  local_14 = d;
  pHStack_10 = this;
  Calendar::Calendar(&this->super_Calendar);
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105d90;
  (this->super_Calendar).year = (local_14 + -0x14f4f5) / 0x16e;
  while( true ) {
    iVar2 = local_14;
    HebrewCalendar(&local_30,7,1,(this->super_Calendar).year + 1);
    iVar1 = operator_cast_to_int(&local_30);
    iVar3 = local_14;
    if (iVar2 < iVar1) break;
    (this->super_Calendar).year = (this->super_Calendar).year + 1;
  }
  HebrewCalendar(&local_48,1,1,(this->super_Calendar).year);
  iVar2 = operator_cast_to_int(&local_48);
  if (iVar3 < iVar2) {
    (this->super_Calendar).month = 7;
  }
  else {
    (this->super_Calendar).month = 1;
  }
  while( true ) {
    iVar3 = local_14;
    iVar2 = (this->super_Calendar).month;
    iVar1 = LastMonthDay(this,(this->super_Calendar).month,(this->super_Calendar).year);
    HebrewCalendar(&local_60,iVar2,iVar1,(this->super_Calendar).year);
    iVar1 = operator_cast_to_int(&local_60);
    iVar2 = local_14;
    if (iVar3 <= iVar1) break;
    (this->super_Calendar).month = (this->super_Calendar).month + 1;
  }
  HebrewCalendar(&local_78,(this->super_Calendar).month,1,(this->super_Calendar).year);
  iVar3 = operator_cast_to_int(&local_78);
  (this->super_Calendar).day = (iVar2 - iVar3) + 1;
  return;
}

Assistant:

HebrewCalendar::HebrewCalendar(int d) { // Computes the HebrewCalendar date from the absolute date.
    year = (d + HebrewEpoch) / 366; // Approximation from below.
    // Search forward for year from the approximation.
    while (d >= HebrewCalendar(7, 1, year + 1))
        year++;
    // Search forward for month from either Tishri or Nisan.
    if (d < HebrewCalendar(1, 1, year))
        month = 7;  //  Start at Tishri
    else
        month = 1;  //  Start at Nisan
    while (d > HebrewCalendar(month, (LastMonthDay(month, year)), year))
        month++;
    // Calculate the day by subtraction.
    day = d - HebrewCalendar(month, 1, year) + 1;
}